

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

void __thiscall
trackerboy::apu::Hardware::setMix(Hardware *this,ChannelMix *mix,Mixer *mixer,uint32_t cycletime)

{
  MixMode MVar1;
  undefined8 uVar2;
  MixMode MVar3;
  size_t i;
  long lVar4;
  float dcLeft;
  float dcRight;
  float fVar5;
  
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    MVar1 = mix->_M_elems[lVar4];
    MVar3 = (this->mMix)._M_elems[lVar4];
    if (MVar1 != MVar3) {
      MVar3 = MVar3 ^ MVar1;
      fVar5 = 7.5 - (float)(this->mLastOutputs)._M_elems[lVar4];
      dcRight = 0.0;
      dcLeft = 0.0;
      if (((MVar3 & left) != mute) &&
         (dcLeft = mixer->mVolumeStepLeft * fVar5, (MVar1 & left) != mute)) {
        dcLeft = -dcLeft;
      }
      if (((MVar3 & right) != mute) &&
         (dcRight = fVar5 * mixer->mVolumeStepRight, (MVar1 & right) != mute)) {
        dcRight = -dcRight;
      }
      Mixer::mixDc(mixer,dcLeft,dcRight,cycletime);
    }
  }
  uVar2 = *(undefined8 *)(mix->_M_elems + 2);
  *(undefined8 *)(this->mMix)._M_elems = *(undefined8 *)mix->_M_elems;
  *(undefined8 *)((this->mMix)._M_elems + 2) = uVar2;
  return;
}

Assistant:

void Hardware::setMix(const ChannelMix &mix, Mixer &mixer, uint32_t cycletime) noexcept {

    // check for changes in the mix
    for (size_t i = 0; i < mMix.size(); ++i) {
        auto const next = mix[i];
        auto &last = mMix[i];

        if (next != last) {
            auto changes = +last ^ +next;

            float dcLeft = 0.0f;
            float dcRight = 0.0f;
            auto const level = 7.5f - mLastOutputs[i];
            if (changes & MIX_LEFT) {
                dcLeft = mixer.leftVolume() * level;
                if (modePansLeft(next)) {
                    dcLeft = -dcLeft;
                }
            }

            if (changes & MIX_RIGHT) {
                dcRight = mixer.rightVolume() * level;
                if (modePansRight(next)) {
                    dcRight = -dcRight;
                }
            }

            mixer.mixDc(dcLeft, dcRight, cycletime);
        }
    }


    mMix = mix;
}